

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O1

Factor * __thiscall libDAI::IJGP::belief(Factor *__return_storage_ptr__,IJGP *this,VarSet *ns)

{
  bool bVar1;
  pointer this_00;
  
  this_00 = (this->_Qb).
            super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->_Qb).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    do {
      bVar1 = VarSet::includes(&this_00->_vs,ns);
      if (bVar1) break;
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->_Qb).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (this_00 ==
      (this->_Qb).
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    for (this_00 = (this->_Qa).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (this->_Qa).
        super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      bVar1 = VarSet::includes(&this_00->_vs,ns);
      if (bVar1) break;
    }
  }
  TFactor<double>::marginal(__return_storage_ptr__,this_00,ns,true);
  return __return_storage_ptr__;
}

Assistant:

Factor IJGP::belief( const VarSet &ns ) const {
        vector<Factor>::const_iterator beta;
        for( beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            if( beta->vars() >> ns )
                break;
        if( beta != _Qb.end() )
            return( beta->marginal(ns) );
        else {
            vector<Factor>::const_iterator alpha;
            for( alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
                if( alpha->vars() >> ns )
                    break;
            assert( alpha != _Qa.end() );
            return( alpha->marginal(ns) );
        }
    }